

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O2

void __thiscall
lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
proposeMove(GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *this,
           size_t v0,size_t v1)

{
  EdgeOperation move;
  EdgeOperation local_40;
  
  increaseEdition(this,v0,v1);
  DynamicLineage<std::vector<double,_std::allocator<double>_>_>::proposeMove
            (&local_40,&this->super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>,v0
             ,v1);
  if (local_40.delta <= 0.0) {
    local_40.edition = getEdition(this,local_40.v0,local_40.v1);
    std::
    priority_queue<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::vector<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>,_std::less<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
    ::push(&this->queue_,&local_40);
  }
  return;
}

Assistant:

inline void proposeMove(const size_t v0, const size_t v1)
    {
        increaseEdition(v0, v1); // invalidate old moves along (v0, v1)
        auto move = DynamicLineage<EVA>::proposeMove(v0, v1);
        if (move.delta <= .0) {
            move.edition = getEdition(move.v0, move.v1);
            queue_.push(move);
        }
    }